

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::simplify(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *lp,Real remainingTime,bool keepbounds,uint32_t seed)

{
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  pointer pnVar4;
  int *piVar5;
  type_conflict5 tVar6;
  bool bVar7;
  Result RVar8;
  double *pdVar9;
  ulong *puVar10;
  SPxOut *pSVar11;
  undefined7 in_register_00000011;
  int j;
  long lVar12;
  int i;
  int iVar13;
  long lVar14;
  Real RVar15;
  bool again;
  int local_1c0;
  int local_1bc;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *local_1b8;
  undefined4 local_1b0;
  Verbosity old_verbosity;
  Verbosity old_verbosity_1;
  uint uStack_1a4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1a0;
  uint local_198 [2];
  uint auStack_190 [2];
  uint local_188 [2];
  int local_180;
  bool local_17c;
  fpclass_type local_178;
  int32_t iStack_174;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_170;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_168;
  cpp_dec_float<50U,_int,_void> local_160;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).spxout = lp->spxout;
  this->m_thesense = lp->thesense;
  (*((this->
     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     ).m_timeUsed)->_vptr_Timer[2])(remainingTime);
  (*((this->
     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     ).m_timeUsed)->_vptr_Timer[3])();
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)
             &(this->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).m_objoffset,0.0);
  pdVar9 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)&old_verbosity_1,-*pdVar9,(type *)0x0);
  *(uint (*) [2])((this->m_cutoffbound).m_backend.data._M_elems + 8) = local_188;
  *(uint (*) [2])((this->m_cutoffbound).m_backend.data._M_elems + 4) = local_198;
  *(uint (*) [2])((this->m_cutoffbound).m_backend.data._M_elems + 6) = auStack_190;
  *(ulong *)(this->m_cutoffbound).m_backend.data._M_elems = CONCAT44(uStack_1a4,old_verbosity_1);
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   ((this->m_cutoffbound).m_backend.data._M_elems + 2) = _Stack_1a0._M_pi;
  (this->m_cutoffbound).m_backend.exp = local_180;
  (this->m_cutoffbound).m_backend.neg = local_17c;
  (this->m_cutoffbound).m_backend.fpclass = local_178;
  (this->m_cutoffbound).m_backend.prec_elem = iStack_174;
  pdVar9 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)&old_verbosity_1,-*pdVar9,(type *)0x0);
  *(uint (*) [2])((this->m_pseudoobj).m_backend.data._M_elems + 8) = local_188;
  *(uint (*) [2])((this->m_pseudoobj).m_backend.data._M_elems + 4) = local_198;
  *(uint (*) [2])((this->m_pseudoobj).m_backend.data._M_elems + 6) = auStack_190;
  *(ulong *)(this->m_pseudoobj).m_backend.data._M_elems = CONCAT44(uStack_1a4,old_verbosity_1);
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   ((this->m_pseudoobj).m_backend.data._M_elems + 2) = _Stack_1a0._M_pi;
  (this->m_pseudoobj).m_backend.exp = local_180;
  (this->m_pseudoobj).m_backend.neg = local_17c;
  (this->m_pseudoobj).m_backend.fpclass = local_178;
  (this->m_pseudoobj).m_backend.prec_elem = iStack_174;
  this->m_result = OKAY;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_remRows = 0;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_remCols = 0;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_remNzos = 0;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_chgBnds = 0;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_chgBnds = 0;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_chgLRhs = 0;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_keptBnds = 0;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_keptLRhs = 0;
  again = true;
  if (0 < (int)((ulong)((long)(this->m_hist).data.
                              super__Vector_base<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_hist).data.
                             super__Vector_base<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
    std::
    vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
    ::clear(&(this->m_hist).data);
  }
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
  ::resize(&(this->m_hist).data,0);
  this->m_postsolved = false;
  pSVar11 = (this->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).spxout;
  local_1b0 = (undefined4)CONCAT71(in_register_00000011,keepbounds);
  if ((pSVar11 != (SPxOut *)0x0) && (3 < (int)pSVar11->m_verbosity)) {
    old_verbosity_1 = INFO2;
    old_verbosity = pSVar11->m_verbosity;
    (*pSVar11->_vptr_SPxOut[2])();
    local_1b8 = &(this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>;
    lVar12 = 0;
    local_1bc = 0;
    local_1c0 = 0;
    local_170 = this;
    for (lVar14 = 0;
        lVar14 < (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum; lVar14 = lVar14 + 1) {
      pnVar4 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar10 = (ulong *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)&old_verbosity_1,
                 (double)(*puVar10 ^ (ulong)DAT_002ce2e0),(type *)0x0);
      tVar6 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)((long)(pnVar4->m_backend).data._M_elems + lVar12),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&old_verbosity_1);
      if (tVar6) {
        pnVar4 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar9 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&local_160,*pdVar9,(type *)0x0);
        tVar6 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)(pnVar4->m_backend).data._M_elems + lVar12),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_160);
        this = local_170;
        if (tVar6) {
          pnVar4 = (lp->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_68.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar12 + 0x20);
          puVar1 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar12);
          local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
          local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar12 + 0x10);
          local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
          local_68.m_backend.exp = *(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar12);
          local_68.m_backend.neg = *(bool *)((long)(&(pnVar4->m_backend).data + 1) + lVar12 + 4U);
          local_68.m_backend._48_8_ =
               *(undefined8 *)((long)(&(pnVar4->m_backend).data + 1) + lVar12 + 8U);
          pnVar4 = (lp->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_a8.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar12 + 0x20);
          puVar1 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar12);
          local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
          local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar12 + 0x10);
          local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
          local_a8.m_backend.exp = *(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar12);
          local_a8.m_backend.neg = *(bool *)((long)(&(pnVar4->m_backend).data + 1) + lVar12 + 4U);
          local_a8.m_backend._48_8_ =
               *(undefined8 *)((long)(&(pnVar4->m_backend).data + 1) + lVar12 + 8U);
          std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)
                     &old_verbosity_1,local_1b8);
          RVar15 = Tolerances::epsilon((Tolerances *)CONCAT44(uStack_1a4,old_verbosity_1));
          bVar7 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                            (&local_68,&local_a8,RVar15);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1a0);
          this = local_170;
          if (bVar7) {
            local_1c0 = local_1c0 + 1;
          }
          else {
            local_1bc = local_1bc + 1;
          }
        }
      }
      lVar12 = lVar12 + 0x38;
    }
    lVar14 = 0;
    local_1b8 = (__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)
                ((ulong)local_1b8 & 0xffffffff00000000);
    local_168 = lp;
    for (lVar12 = 0;
        lVar12 < (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum; lVar12 = lVar12 + 1) {
      pnVar4 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar10 = (ulong *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)&old_verbosity_1,
                 (double)(*puVar10 ^ (ulong)DAT_002ce2e0),(type *)0x0);
      tVar6 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)((long)(pnVar4->m_backend).data._M_elems + lVar14),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&old_verbosity_1);
      if (tVar6) {
        pnVar4 = (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).up.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar9 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&local_160,*pdVar9,(type *)0x0);
        lp = local_168;
        tVar6 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)(pnVar4->m_backend).data._M_elems + lVar14),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_160);
        local_1b8 = (__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)
                    CONCAT44(local_1b8._4_4_,(int)local_1b8 + (uint)tVar6);
      }
      lVar14 = lVar14 + 0x38;
    }
    pSVar11 = soplex::operator<<((this->
                                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).spxout,"LP has ");
    pSVar11 = soplex::operator<<(pSVar11,local_1c0);
    pSVar11 = soplex::operator<<(pSVar11," equations, ");
    pSVar11 = soplex::operator<<(pSVar11,local_1bc);
    pSVar11 = soplex::operator<<(pSVar11," ranged rows, ");
    pSVar11 = soplex::operator<<(pSVar11,(int)local_1b8);
    pSVar11 = soplex::operator<<(pSVar11," boxed columns");
    std::endl<char,std::char_traits<char>>(pSVar11->m_streams[pSVar11->m_verbosity]);
    pSVar11 = (this->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    (*pSVar11->_vptr_SPxOut[2])(pSVar11,&old_verbosity);
    keepbounds = SUB41(local_1b0,0);
  }
  DataArray<int>::reSize(&this->m_stat,0x11);
  piVar5 = (this->m_stat).data;
  for (lVar12 = 0; lVar12 < (this->m_stat).thesize; lVar12 = lVar12 + 1) {
    piVar5[lVar12] = 0;
  }
  this->m_addedcols = 0;
  handleRowObjectives(this,lp);
  iVar13 = 1;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(&this->m_prim,
          (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum,true);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(&this->m_slack,
          (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum,true);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(&this->m_dual,
          (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum,true);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(&this->m_redCost,
          (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum,true);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::reSize(&this->m_cBasisStat,
           (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::reSize(&this->m_rBasisStat,
           (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum);
  DataArray<int>::reSize
            (&this->m_cIdx,
             (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum);
  DataArray<int>::reSize
            (&this->m_rIdx,
             (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum);
  Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::reSize(&this->m_classSetRows,
           (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum);
  Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::reSize(&this->m_classSetCols,
           (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum);
  Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::reSize(&this->m_dupRows,
           (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum);
  Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::reSize(&this->m_dupCols,
           (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum);
  this->m_keepbounds = keepbounds;
  piVar5 = (this->m_rIdx).data;
  for (lVar12 = 0;
      lVar12 < (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum; lVar12 = lVar12 + 1) {
    piVar5[lVar12] = (int)lVar12;
  }
  piVar5 = (this->m_cIdx).data;
  for (lVar12 = 0;
      lVar12 < (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum; lVar12 = lVar12 + 1) {
    piVar5[lVar12] = (int)lVar12;
  }
  handleExtremes(this,lp);
  RVar8 = this->m_result;
  while ((again == true && (RVar8 == OKAY))) {
    pSVar11 = (this->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    if ((pSVar11 == (SPxOut *)0x0) || ((int)pSVar11->m_verbosity < 5)) {
LAB_0028decf:
      again = false;
      RVar8 = simplifyRows(this,lp,&again);
      this->m_result = RVar8;
      if (RVar8 == OKAY) {
        RVar8 = simplifyCols(this,lp,&again);
        this->m_result = RVar8;
      }
    }
    else {
      local_160.data._M_elems[0] = 5;
      old_verbosity_1 = pSVar11->m_verbosity;
      (*pSVar11->_vptr_SPxOut[2])(pSVar11,&local_160);
      pSVar11 = soplex::operator<<((this->
                                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).spxout,"Round ");
      pSVar11 = soplex::operator<<(pSVar11,iVar13);
      pSVar11 = soplex::operator<<(pSVar11,":");
      std::endl<char,std::char_traits<char>>(pSVar11->m_streams[pSVar11->m_verbosity]);
      pSVar11 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar11->_vptr_SPxOut[2])(pSVar11,&old_verbosity_1);
      RVar8 = this->m_result;
      again = false;
      if (RVar8 == OKAY) goto LAB_0028decf;
    }
    if (again == false) {
      if (RVar8 == OKAY) {
        RVar8 = simplifyDual(this,lp,&again);
        this->m_result = RVar8;
      }
      if ((again & 1U) == 0) {
        if (RVar8 == OKAY) {
          RVar8 = duplicateRows(this,lp,&again);
          this->m_result = RVar8;
          if (RVar8 == OKAY) {
            RVar8 = duplicateCols(this,lp,&again);
            this->m_result = RVar8;
          }
        }
        if (again != true) {
          trivialHeuristic(this,lp);
          propagatePseudoobj(this,lp);
          RVar8 = this->m_result;
          if (RVar8 == OKAY) {
            RVar8 = multiaggregation(this,lp,&again);
            this->m_result = RVar8;
          }
        }
      }
    }
    iVar13 = iVar13 + 1;
  }
  if (RVar8 != OKAY) {
    pSVar11 = (this->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    if ((pSVar11 != (SPxOut *)0x0) &&
       (old_verbosity_1 = pSVar11->m_verbosity, 2 < (int)old_verbosity_1)) {
      local_160.data._M_elems[0] = 3;
      (*pSVar11->_vptr_SPxOut[2])();
      pSVar11 = soplex::operator<<((this->
                                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).spxout,"Simplifier result: ");
      pSVar11 = soplex::operator<<(pSVar11,this->m_result);
      std::endl<char,std::char_traits<char>>(pSVar11->m_streams[pSVar11->m_verbosity]);
      pSVar11 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar11->_vptr_SPxOut[2])(pSVar11,&old_verbosity_1);
    }
    goto LAB_0028e77b;
  }
  iVar13 = this->m_addedcols;
  uVar2 = (this->
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_remCols;
  uVar3 = (this->
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_remNzos;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_remCols = uVar2 - iVar13;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_remNzos = uVar3 - iVar13;
  pSVar11 = (this->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).spxout;
  if (pSVar11 == (SPxOut *)0x0) {
LAB_0028e463:
    pSVar11 = (SPxOut *)0x0;
  }
  else {
    if (2 < (int)pSVar11->m_verbosity) {
      local_160.data._M_elems[0] = 3;
      old_verbosity_1 = pSVar11->m_verbosity;
      (*pSVar11->_vptr_SPxOut[2])();
      pSVar11 = soplex::operator<<((this->
                                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).spxout,"Simplifier removed ");
      pSVar11 = soplex::operator<<(pSVar11,(this->
                                           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).m_remRows);
      pSVar11 = soplex::operator<<(pSVar11," rows, ");
      pSVar11 = soplex::operator<<(pSVar11,(this->
                                           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).m_remCols);
      pSVar11 = soplex::operator<<(pSVar11," columns, ");
      pSVar11 = soplex::operator<<(pSVar11,(this->
                                           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).m_remNzos);
      pSVar11 = soplex::operator<<(pSVar11," nonzeros, ");
      pSVar11 = soplex::operator<<(pSVar11,(this->
                                           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).m_chgBnds);
      pSVar11 = soplex::operator<<(pSVar11," col bounds, ");
      pSVar11 = soplex::operator<<(pSVar11,(this->
                                           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).m_chgLRhs);
      pSVar11 = soplex::operator<<(pSVar11," row bounds");
      std::endl<char,std::char_traits<char>>(pSVar11->m_streams[pSVar11->m_verbosity]);
      pSVar11 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar11->_vptr_SPxOut[2])(pSVar11,&old_verbosity_1);
      pSVar11 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
    }
    if ((char)local_1b0 != '\0') {
      if (pSVar11 != (SPxOut *)0x0) {
        if (3 < (int)pSVar11->m_verbosity) {
          local_160.data._M_elems[0] = 4;
          old_verbosity_1 = pSVar11->m_verbosity;
          (*pSVar11->_vptr_SPxOut[2])();
          pSVar11 = soplex::operator<<((this->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).spxout,"Simplifier kept ");
          pSVar11 = soplex::operator<<(pSVar11,(this->
                                               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               ).m_keptBnds);
          pSVar11 = soplex::operator<<(pSVar11," column bounds, ");
          pSVar11 = soplex::operator<<(pSVar11,(this->
                                               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               ).m_keptLRhs);
          pSVar11 = soplex::operator<<(pSVar11," row bounds");
          std::endl<char,std::char_traits<char>>(pSVar11->m_streams[pSVar11->m_verbosity]);
          pSVar11 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          (*pSVar11->_vptr_SPxOut[2])(pSVar11,&old_verbosity_1);
          pSVar11 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          goto LAB_0028e1ce;
        }
        goto LAB_0028e1d7;
      }
      goto LAB_0028e463;
    }
LAB_0028e1ce:
    if (pSVar11 == (SPxOut *)0x0) goto LAB_0028e463;
LAB_0028e1d7:
    if (2 < (int)pSVar11->m_verbosity) {
      local_160.data._M_elems[0] = 3;
      old_verbosity_1 = pSVar11->m_verbosity;
      (*pSVar11->_vptr_SPxOut[2])();
      pSVar11 = soplex::operator<<((this->
                                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).spxout,"Reduced LP has ");
      pSVar11 = soplex::operator<<(pSVar11,(lp->
                                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).
                                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           .set.thenum);
      pSVar11 = soplex::operator<<(pSVar11," rows ");
      pSVar11 = soplex::operator<<(pSVar11,(lp->
                                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).
                                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           .set.thenum);
      pSVar11 = soplex::operator<<(pSVar11," columns ");
      iVar13 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::nNzos(lp);
      pSVar11 = soplex::operator<<(pSVar11,iVar13);
      pSVar11 = soplex::operator<<(pSVar11," nonzeros");
      std::endl<char,std::char_traits<char>>(pSVar11->m_streams[pSVar11->m_verbosity]);
      pSVar11 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar11->_vptr_SPxOut[2])(pSVar11,&old_verbosity_1);
      pSVar11 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      if (pSVar11 == (SPxOut *)0x0) goto LAB_0028e463;
    }
    if (3 < (int)pSVar11->m_verbosity) {
      old_verbosity_1 = INFO2;
      old_verbosity = pSVar11->m_verbosity;
      (*pSVar11->_vptr_SPxOut[2])();
      local_1b8 = &(this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>;
      lVar14 = 0;
      local_1bc = 0;
      local_1c0 = 0;
      for (lVar12 = 0;
          lVar12 < (lp->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum; lVar12 = lVar12 + 1) {
        pnVar4 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar10 = (ulong *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)&old_verbosity_1,
                   (double)(*puVar10 ^ (ulong)DAT_002ce2e0),(type *)0x0);
        tVar6 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)(pnVar4->m_backend).data._M_elems + lVar14),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&old_verbosity_1);
        if (tVar6) {
          pnVar4 = (lp->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar9 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&local_160,*pdVar9,(type *)0x0);
          tVar6 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)((long)(pnVar4->m_backend).data._M_elems + lVar14),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_160);
          if (tVar6) {
            pnVar4 = (lp->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).left.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_e8.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar14 + 0x20);
            puVar1 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar14);
            local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
            local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar14 + 0x10);
            local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
            local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
            local_e8.m_backend.exp = *(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar14);
            local_e8.m_backend.neg = *(bool *)((long)(&(pnVar4->m_backend).data + 1) + lVar14 + 4U);
            local_e8.m_backend._48_8_ =
                 *(undefined8 *)((long)(&(pnVar4->m_backend).data + 1) + lVar14 + 8U);
            pnVar4 = (lp->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).right.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_128.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar14 + 0x20);
            puVar1 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar14);
            local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
            local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar14 + 0x10);
            local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
            local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
            local_128.m_backend.exp = *(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar14);
            local_128.m_backend.neg = *(bool *)((long)(&(pnVar4->m_backend).data + 1) + lVar14 + 4U)
            ;
            local_128.m_backend._48_8_ =
                 *(undefined8 *)((long)(&(pnVar4->m_backend).data + 1) + lVar14 + 8U);
            std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)
                       &old_verbosity_1,local_1b8);
            RVar15 = Tolerances::epsilon((Tolerances *)CONCAT44(uStack_1a4,old_verbosity_1));
            bVar7 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                              (&local_e8,&local_128,RVar15);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1a0);
            if (bVar7) {
              local_1c0 = local_1c0 + 1;
            }
            else {
              local_1bc = local_1bc + 1;
            }
          }
        }
        lVar14 = lVar14 + 0x38;
      }
      lVar14 = 0;
      local_1b8 = (__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)
                  ((ulong)local_1b8 & 0xffffffff00000000);
      for (lVar12 = 0;
          lVar12 < (lp->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum; lVar12 = lVar12 + 1) {
        pnVar4 = (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar10 = (ulong *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)&old_verbosity_1,
                   (double)(*puVar10 ^ (ulong)DAT_002ce2e0),(type *)0x0);
        tVar6 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)(pnVar4->m_backend).data._M_elems + lVar14),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&old_verbosity_1);
        if (tVar6) {
          pnVar4 = (lp->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).up.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar9 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&local_160,*pdVar9,(type *)0x0);
          tVar6 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)((long)(pnVar4->m_backend).data._M_elems + lVar14),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_160);
          local_1b8 = (__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)
                      CONCAT44(local_1b8._4_4_,(int)local_1b8 + (uint)tVar6);
        }
        lVar14 = lVar14 + 0x38;
      }
      pSVar11 = soplex::operator<<((this->
                                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).spxout,"Reduced LP has ");
      pSVar11 = soplex::operator<<(pSVar11,local_1c0);
      pSVar11 = soplex::operator<<(pSVar11," equations, ");
      pSVar11 = soplex::operator<<(pSVar11,local_1bc);
      pSVar11 = soplex::operator<<(pSVar11," ranged rows, ");
      pSVar11 = soplex::operator<<(pSVar11,(int)local_1b8);
      pSVar11 = soplex::operator<<(pSVar11," boxed columns");
      std::endl<char,std::char_traits<char>>(pSVar11->m_streams[pSVar11->m_verbosity]);
      pSVar11 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar11->_vptr_SPxOut[2])(pSVar11,&old_verbosity);
      pSVar11 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
    }
  }
  if ((lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum == 0 &&
      (lp->
      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum == 0) {
    if (pSVar11 == (SPxOut *)0x0) {
      pSVar11 = (SPxOut *)0x0;
    }
    else if (2 < (int)pSVar11->m_verbosity) {
      local_160.data._M_elems[0] = 3;
      old_verbosity_1 = pSVar11->m_verbosity;
      (*pSVar11->_vptr_SPxOut[2])();
      pSVar11 = soplex::operator<<((this->
                                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).spxout,"Simplifier removed all rows and columns");
      std::endl<char,std::char_traits<char>>(pSVar11->m_streams[pSVar11->m_verbosity]);
      pSVar11 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar11->_vptr_SPxOut[2])(pSVar11,&old_verbosity_1);
      pSVar11 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
    }
    this->m_result = VANISHED;
  }
  if ((pSVar11 != (SPxOut *)0x0) && (3 < (int)pSVar11->m_verbosity)) {
    local_160.data._M_elems[0] = 4;
    old_verbosity_1 = pSVar11->m_verbosity;
    (*pSVar11->_vptr_SPxOut[2])();
    pSVar11 = soplex::operator<<((this->
                                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).spxout,"\nSimplifier performed:\n");
    pSVar11 = soplex::operator<<(pSVar11,*(this->m_stat).data);
    pSVar11 = soplex::operator<<(pSVar11," empty rows\n");
    pSVar11 = soplex::operator<<(pSVar11,(this->m_stat).data[1]);
    pSVar11 = soplex::operator<<(pSVar11," free rows\n");
    pSVar11 = soplex::operator<<(pSVar11,(this->m_stat).data[2]);
    pSVar11 = soplex::operator<<(pSVar11," singleton rows\n");
    pSVar11 = soplex::operator<<(pSVar11,(this->m_stat).data[3]);
    pSVar11 = soplex::operator<<(pSVar11," forcing rows\n");
    pSVar11 = soplex::operator<<(pSVar11,(this->m_stat).data[4]);
    pSVar11 = soplex::operator<<(pSVar11," empty columns\n");
    pSVar11 = soplex::operator<<(pSVar11,(this->m_stat).data[5]);
    pSVar11 = soplex::operator<<(pSVar11," fixed columns\n");
    pSVar11 = soplex::operator<<(pSVar11,(this->m_stat).data[6]);
    pSVar11 = soplex::operator<<(pSVar11," free columns with zero objective\n");
    pSVar11 = soplex::operator<<(pSVar11,(this->m_stat).data[7]);
    pSVar11 = soplex::operator<<(pSVar11," singleton columns with zero objective\n");
    pSVar11 = soplex::operator<<(pSVar11,(this->m_stat).data[8]);
    pSVar11 = soplex::operator<<(pSVar11," singleton columns combined with a doubleton equation\n");
    pSVar11 = soplex::operator<<(pSVar11,(this->m_stat).data[9]);
    pSVar11 = soplex::operator<<(pSVar11," free singleton columns\n");
    pSVar11 = soplex::operator<<(pSVar11,(this->m_stat).data[10]);
    pSVar11 = soplex::operator<<(pSVar11," dominated columns\n");
    pSVar11 = soplex::operator<<(pSVar11,(this->m_stat).data[0xb]);
    pSVar11 = soplex::operator<<(pSVar11," weakly dominated columns\n");
    pSVar11 = soplex::operator<<(pSVar11,(this->m_stat).data[0xc]);
    pSVar11 = soplex::operator<<(pSVar11," duplicate rows\n");
    pSVar11 = soplex::operator<<(pSVar11,(this->m_stat).data[0xd]);
    pSVar11 = soplex::operator<<(pSVar11," duplicate columns (fixed)\n");
    pSVar11 = soplex::operator<<(pSVar11,(this->m_stat).data[0xe]);
    pSVar11 = soplex::operator<<(pSVar11," duplicate columns (substituted)\n");
    pSVar11 = soplex::operator<<(pSVar11,(this->m_stat).data[0xf]);
    pSVar11 = soplex::operator<<(pSVar11," variable aggregations\n");
    pSVar11 = soplex::operator<<(pSVar11,(this->m_stat).data[0x10]);
    pSVar11 = soplex::operator<<(pSVar11," multi aggregations\n");
    std::endl<char,std::char_traits<char>>(pSVar11->m_streams[pSVar11->m_verbosity]);
    pSVar11 = (this->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    (*pSVar11->_vptr_SPxOut[2])(pSVar11,&old_verbosity_1);
  }
  (*((this->
     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     ).m_timeUsed)->_vptr_Timer[4])();
LAB_0028e77b:
  return this->m_result;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::simplify(SPxLPBase<R>& lp, Real remainingTime,
      bool keepbounds, uint32_t seed)
{
   // transfer message handler
   this->spxout = lp.spxout;
   assert(this->spxout != nullptr);

   m_thesense = lp.spxSense();
   this->m_timeUsed->reset();
   this->m_timeUsed->start();

   this->m_objoffset = 0.0;
   m_cutoffbound = R(-infinity);
   m_pseudoobj = R(-infinity);

   this->m_remRows = 0;
   this->m_remCols = 0;
   this->m_remNzos = 0;
   this->m_chgBnds = 0;
   this->m_chgLRhs = 0;
   this->m_keptBnds = 0;
   this->m_keptLRhs = 0;

   m_result     = this->OKAY;
   bool   again = true;
   int nrounds = 0;

   if(m_hist.size() > 0)
   {
      m_hist.clear();
   }

   m_hist.reSize(0);
   m_postsolved = false;

   SPX_MSG_INFO2((*this->spxout),
                 int numRangedRows = 0;
                 int numBoxedCols = 0;
                 int numEqualities = 0;

                 for(int i = 0; i < lp.nRows(); ++i)
{
   if(lp.lhs(i) > R(-infinity) && lp.rhs(i) < R(infinity))
      {
         if(EQ(lp.lhs(i), lp.rhs(i), this->tolerances()->epsilon()))
            ++numEqualities;
         else
            ++numRangedRows;
      }
   }
   for(int j = 0; j < lp.nCols(); ++j)
   if(lp.lower(j) > R(-infinity) && lp.upper(j) < R(infinity))
      ++numBoxedCols;

      (*this->spxout) << "LP has "
                      << numEqualities << " equations, "
                      << numRangedRows << " ranged rows, "
                      << numBoxedCols << " boxed columns"
                      << std::endl;
                   )

         m_stat.reSize(17);

   for(int k = 0; k < m_stat.size(); ++k)
      m_stat[k] = 0;

   m_addedcols = 0;
   handleRowObjectives(lp);

   m_prim.reDim(lp.nCols());
   m_slack.reDim(lp.nRows());
   m_dual.reDim(lp.nRows());
   m_redCost.reDim(lp.nCols());
   m_cBasisStat.reSize(lp.nCols());
   m_rBasisStat.reSize(lp.nRows());
   m_cIdx.reSize(lp.nCols());
   m_rIdx.reSize(lp.nRows());

   m_classSetRows.reSize(lp.nRows());
   m_classSetCols.reSize(lp.nCols());
   m_dupRows.reSize(lp.nRows());
   m_dupCols.reSize(lp.nCols());

   m_keepbounds = keepbounds;

   for(int i = 0; i < lp.nRows(); ++i)
      m_rIdx[i] = i;

   for(int j = 0; j < lp.nCols(); ++j)
      m_cIdx[j] = j;

   // round extreme values (set all values smaller than this->eps to zero and all values bigger than R(infinity)/5 to R(infinity))
#if SOPLEX_EXTREMES
   handleExtremes(lp);
#endif

   // main presolving loop
   while(again && m_result == this->OKAY)
   {
      nrounds++;
      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Round " << nrounds << ":" << std::endl;)
      again = false;

#if SOPLEX_ROWS_SPXMAINSM

      if(m_result == this->OKAY)
         m_result = simplifyRows(lp, again);

#endif

#if SOPLEX_COLS_SPXMAINSM

      if(m_result == this->OKAY)
         m_result = simplifyCols(lp, again);

#endif

      if(again)
         continue;

#if SOPLEX_DUAL_SPXMAINSM

      if(m_result == this->OKAY)
         m_result = simplifyDual(lp, again);

#endif

      if(again)
         continue;

#if SOPLEX_DUPLICATE_ROWS

      if(m_result == this->OKAY)
         m_result = duplicateRows(lp, again);

#endif

#if SOPLEX_DUPLICATE_COLS

      if(m_result == this->OKAY)
         m_result = duplicateCols(lp, again);

#endif

      if(!again)
      {
#if SOPLEX_TRIVIAL_HEURISTICS
         trivialHeuristic(lp);
#endif

#if SOPLEX_PSEUDOOBJ
         propagatePseudoobj(lp);
#endif

#if SOPLEX_MULTI_AGGREGATE

         if(m_result == this->OKAY)
            m_result = multiaggregation(lp, again);

#endif
      }

   }

   // preprocessing detected infeasibility or unboundedness
   if(m_result != this->OKAY)
   {
      SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Simplifier result: " << static_cast<int>
                    (m_result) << std::endl;)
      return m_result;
   }

   this->m_remCols -= m_addedcols;
   this->m_remNzos -= m_addedcols;
   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Simplifier removed "
                 << this->m_remRows << " rows, "
                 << this->m_remCols << " columns, "
                 << this->m_remNzos << " nonzeros, "
                 << this->m_chgBnds << " col bounds, "
                 << this->m_chgLRhs << " row bounds"
                 << std::endl;)

   if(keepbounds)
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier kept "
                    << this->m_keptBnds << " column bounds, "
                    << this->m_keptLRhs << " row bounds"
                    << std::endl;)

      SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Reduced LP has "
                    << lp.nRows() << " rows "
                    << lp.nCols() << " columns "
                    << lp.nNzos() << " nonzeros"
                    << std::endl;)

      SPX_MSG_INFO2((*this->spxout),
                    int numRangedRows = 0;
                    int numBoxedCols  = 0;
                    int numEqualities = 0;

                    for(int i = 0; i < lp.nRows(); ++i)
   {
      if(lp.lhs(i) > R(-infinity) && lp.rhs(i) < R(infinity))
         {
            if(EQ(lp.lhs(i), lp.rhs(i), this->tolerances()->epsilon()))
               ++numEqualities;
            else
               ++numRangedRows;
         }
      }
   for(int j = 0; j < lp.nCols(); ++j)
   if(lp.lower(j) > R(-infinity) && lp.upper(j) < R(infinity))
      ++numBoxedCols;

      (*this->spxout) << "Reduced LP has "
                      << numEqualities << " equations, "
                      << numRangedRows << " ranged rows, "
                      << numBoxedCols << " boxed columns"
                      << std::endl;
                   )

         if(lp.nCols() == 0 && lp.nRows() == 0)
         {
            SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Simplifier removed all rows and columns" <<
                          std::endl;)
            m_result = this->VANISHED;
         }

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "\nSimplifier performed:\n"
                 << m_stat[EMPTY_ROW]            << " empty rows\n"
                 << m_stat[FREE_ROW]             << " free rows\n"
                 << m_stat[SINGLETON_ROW]        << " singleton rows\n"
                 << m_stat[FORCE_ROW]            << " forcing rows\n"
                 << m_stat[EMPTY_COL]            << " empty columns\n"
                 << m_stat[FIX_COL]              << " fixed columns\n"
                 << m_stat[FREE_ZOBJ_COL]        << " free columns with zero objective\n"
                 << m_stat[ZOBJ_SINGLETON_COL]   << " singleton columns with zero objective\n"
                 << m_stat[DOUBLETON_ROW]        << " singleton columns combined with a doubleton equation\n"
                 << m_stat[FREE_SINGLETON_COL]   << " free singleton columns\n"
                 << m_stat[DOMINATED_COL]        << " dominated columns\n"
                 << m_stat[WEAKLY_DOMINATED_COL] << " weakly dominated columns\n"
                 << m_stat[DUPLICATE_ROW]        << " duplicate rows\n"
                 << m_stat[FIX_DUPLICATE_COL]    << " duplicate columns (fixed)\n"
                 << m_stat[SUB_DUPLICATE_COL]    << " duplicate columns (substituted)\n"
                 << m_stat[AGGREGATION]          << " variable aggregations\n"
                 << m_stat[MULTI_AGG]            << " multi aggregations\n"
                 << std::endl;);

   this->m_timeUsed->stop();

   return m_result;
}